

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_think.cpp
# Opt level: O3

void __thiscall DBot::WhatToGet(DBot *this,AActor *item)

{
  APlayerPawn *this_00;
  AAmmo *pAVar1;
  int iVar2;
  undefined8 in_RAX;
  AActor *pAVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AInventory *pAVar4;
  AWeapon *pAVar5;
  undefined4 extraout_var_01;
  PClassActor *pPVar6;
  PClass *pPVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  PClass *pPVar8;
  undefined4 extraout_var_04;
  PClassActor *pPVar9;
  AAmmo *ammo;
  bool bVar10;
  bool bVar11;
  FName local_28;
  FName local_24;
  
  local_24.Index = (int)((ulong)in_RAX >> 0x20);
  if (((item->renderflags).Value & 0x8000) != 0) {
    return;
  }
  pAVar3 = (this->prev).field_0.p;
  if (pAVar3 == (AActor *)0x0) {
LAB_004a05b3:
    pAVar3 = (AActor *)0x0;
  }
  else if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->prev).field_0.p = (AActor *)0x0;
    goto LAB_004a05b3;
  }
  pPVar8 = AWeapon::RegistrationInfo.MyClass;
  if (pAVar3 == item) {
    return;
  }
  if ((alwaysapplydmflags.Value == false) && (deathmatch.Value == 0)) {
    bVar11 = false;
  }
  else {
    bVar11 = ((byte)dmflags.Value & 4) == 0;
  }
  pPVar6 = (PClassActor *)(item->super_DThinker).super_DObject.Class;
  if (pPVar6 == (PClassActor *)0x0) {
    iVar2 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
    pPVar6 = (PClassActor *)CONCAT44(extraout_var,iVar2);
    (item->super_DThinker).super_DObject.Class = (PClass *)pPVar6;
  }
  pPVar7 = AAmmo::RegistrationInfo.MyClass;
  bVar10 = pPVar6 != (PClassActor *)0x0;
  pPVar9 = pPVar6;
  if (pPVar6 != (PClassActor *)pPVar8 && bVar10) {
    do {
      pPVar9 = (PClassActor *)(pPVar9->super_PClass).ParentClass;
      bVar10 = pPVar9 != (PClassActor *)0x0;
      if (pPVar9 == (PClassActor *)pPVar8) break;
    } while (pPVar9 != (PClassActor *)0x0);
  }
  if (bVar10) {
    this_00 = this->player->mo;
    if (pPVar6 == (PClassActor *)0x0) {
      iVar2 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
      pPVar6 = (PClassActor *)CONCAT44(extraout_var_00,iVar2);
      (item->super_DThinker).super_DObject.Class = (PClass *)pPVar6;
    }
    pAVar4 = AActor::FindInventory(&this_00->super_AActor,pPVar6,false);
    pAVar5 = dyn_cast<AWeapon>((DObject *)pAVar4);
    if (pAVar5 != (AWeapon *)0x0) {
      if (!bVar11) {
        return;
      }
      pAVar1 = (pAVar5->Ammo1).field_0.p;
      if (pAVar1 != (AAmmo *)0x0) {
        if (((pAVar1->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20
            ) == 0) {
          if ((pAVar1->super_AInventory).Amount < (pAVar1->super_AInventory).MaxAmount)
          goto LAB_004a08d8;
        }
        else {
          (pAVar5->Ammo1).field_0.p = (AAmmo *)0x0;
        }
      }
      pAVar1 = (pAVar5->Ammo2).field_0.p;
      if (pAVar1 == (AAmmo *)0x0) {
        return;
      }
      if (((pAVar1->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20)
          != 0) {
        (pAVar5->Ammo2).field_0.p = (AAmmo *)0x0;
        return;
      }
      if ((pAVar1->super_AInventory).MaxAmount <= (pAVar1->super_AInventory).Amount) {
        return;
      }
    }
    goto LAB_004a08d8;
  }
  if (pPVar6 == (PClassActor *)0x0) {
    iVar2 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
    pPVar6 = (PClassActor *)CONCAT44(extraout_var_01,iVar2);
    (item->super_DThinker).super_DObject.Class = (PClass *)pPVar6;
  }
  bVar11 = pPVar6 != (PClassActor *)0x0;
  if (pPVar6 != (PClassActor *)pPVar7 && bVar11) {
    do {
      pPVar6 = (PClassActor *)(pPVar6->super_PClass).ParentClass;
      bVar11 = pPVar6 != (PClassActor *)0x0;
      if (pPVar6 == (PClassActor *)pPVar7) break;
    } while (pPVar6 != (PClassActor *)0x0);
  }
  if (bVar11) {
    pPVar6 = AAmmo::GetParentAmmo((AAmmo *)item);
    pAVar4 = AActor::FindInventory(&this->player->mo->super_AActor,pPVar6,false);
    if ((pAVar4 != (AInventory *)0x0) && (pAVar4->MaxAmount <= pAVar4->Amount)) {
      return;
    }
    goto LAB_004a08d8;
  }
  iVar2 = FName::NameManager::FindName(&FName::NameData,"Megasphere",true);
  _local_28 = CONCAT44(local_24.Index,iVar2);
  pPVar7 = PClass::FindClass(&local_28);
  pPVar8 = (item->super_DThinker).super_DObject.Class;
  if (pPVar8 == (PClass *)0x0) {
    iVar2 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
    pPVar8 = (PClass *)CONCAT44(extraout_var_02,iVar2);
    (item->super_DThinker).super_DObject.Class = pPVar8;
  }
  bVar11 = pPVar8 != (PClass *)0x0;
  if (pPVar8 != pPVar7 && bVar11) {
    do {
      pPVar8 = pPVar8->ParentClass;
      bVar11 = pPVar8 != (PClass *)0x0;
      if (pPVar8 == pPVar7) break;
    } while (pPVar8 != (PClass *)0x0);
  }
  if (bVar11) {
LAB_004a0826:
    if (deh.MaxSoulsphere <= (this->player->mo->super_AActor).health) {
      return;
    }
  }
  else {
    iVar2 = FName::NameManager::FindName(&FName::NameData,"Soulsphere",true);
    _local_28 = CONCAT44(iVar2,local_28.Index);
    pPVar7 = PClass::FindClass(&local_24);
    pPVar8 = (item->super_DThinker).super_DObject.Class;
    if (pPVar8 == (PClass *)0x0) {
      iVar2 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
      pPVar8 = (PClass *)CONCAT44(extraout_var_03,iVar2);
      (item->super_DThinker).super_DObject.Class = pPVar8;
    }
    bVar11 = pPVar8 != (PClass *)0x0;
    if (pPVar8 != pPVar7 && bVar11) {
      do {
        pPVar8 = pPVar8->ParentClass;
        bVar11 = pPVar8 != (PClass *)0x0;
        if (pPVar8 == pPVar7) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    if (bVar11) goto LAB_004a0826;
    pPVar8 = PClass::FindClass("HealthBonus");
    bVar11 = DObject::IsKindOf((DObject *)item,pPVar8);
    if (bVar11) goto LAB_004a0826;
  }
  pPVar7 = AHealth::RegistrationInfo.MyClass;
  pPVar8 = (item->super_DThinker).super_DObject.Class;
  if (pPVar8 == (PClass *)0x0) {
    iVar2 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
    pPVar8 = (PClass *)CONCAT44(extraout_var_04,iVar2);
    (item->super_DThinker).super_DObject.Class = pPVar8;
  }
  bVar11 = pPVar8 != (PClass *)0x0;
  if (pPVar8 != pPVar7 && bVar11) {
    do {
      pPVar8 = pPVar8->ParentClass;
      bVar11 = pPVar8 != (PClass *)0x0;
      if (pPVar8 == pPVar7) break;
    } while (pPVar8 != (PClass *)0x0);
  }
  if ((bVar11) && (deh.MaxHealth <= (this->player->mo->super_AActor).health)) {
    return;
  }
LAB_004a08d8:
  pAVar3 = (this->dest).field_0.p;
  if (pAVar3 != (AActor *)0x0) {
    if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if (((pAVar3->flags).Value & 1) != 0) {
        return;
      }
    }
    else {
      pAVar3 = (AActor *)0x0;
    }
  }
  (this->prev).field_0.p = pAVar3;
  (this->dest).field_0.p = item;
  this->t_roam = 0x8c;
  return;
}

Assistant:

void DBot::WhatToGet (AActor *item)
{
#define typeis(x) item->IsKindOf (PClass::FindClass (#x))
	if ((item->renderflags & RF_INVISIBLE) //Under respawn and away.
		|| item == prev)
	{
		return;
	}
	int weapgiveammo = (alwaysapplydmflags || deathmatch) && !(dmflags & DF_WEAPONS_STAY);

	//if(pos && !bglobal.thingvis[pos->id][item->id]) continue;
//	if (item->IsKindOf (RUNTIME_CLASS(AArtifact)))
//		return;	// don't know how to use artifacts
	if (item->IsKindOf (RUNTIME_CLASS(AWeapon)))
	{
		// FIXME
		AWeapon *heldWeapon;

		heldWeapon = dyn_cast<AWeapon>(player->mo->FindInventory(item->GetClass()));
		if (heldWeapon != NULL)
		{
			if (!weapgiveammo)
				return;
			if ((heldWeapon->Ammo1 == NULL || heldWeapon->Ammo1->Amount >= heldWeapon->Ammo1->MaxAmount) &&
				(heldWeapon->Ammo2 == NULL || heldWeapon->Ammo2->Amount >= heldWeapon->Ammo2->MaxAmount))
			{
				return;
			}
		}
	}
	else if (item->IsKindOf (RUNTIME_CLASS(AAmmo)))
	{
		AAmmo *ammo = static_cast<AAmmo *> (item);
		PClassActor *parent = ammo->GetParentAmmo ();
		AInventory *holdingammo = player->mo->FindInventory (parent);

		if (holdingammo != NULL && holdingammo->Amount >= holdingammo->MaxAmount)
		{
			return;
		}
	}
	else if ((typeis (Megasphere) || typeis (Soulsphere) || typeis (HealthBonus)) && player->mo->health >= deh.MaxSoulsphere)
		return;
	else if (item->IsKindOf (RUNTIME_CLASS(AHealth)) && player->mo->health >= deh.MaxHealth /*MAXHEALTH*/)
		return;

	if ((dest == NULL ||
		!(dest->flags & MF_SPECIAL)/* ||
		!Reachable (dest)*/)/* &&
		Reachable (item)*/)	// Calling Reachable slows this down tremendously
	{
		prev = dest;
		dest = item;
		t_roam = MAXROAM;
	}
}